

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void ppu_mode3_synchronize(Emulator *e)

{
  uint uVar1;
  byte bVar2;
  u8 uVar3;
  TileDataSelect TVar4;
  ObjSize OVar5;
  int iVar6;
  long lVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  RGBA RVar11;
  byte bVar12;
  int iVar13;
  PaletteRGBA *pPVar14;
  byte bVar15;
  ushort uVar16;
  uint uVar17;
  byte bVar18;
  char cVar19;
  uint uVar20;
  ulong uVar21;
  Emulator *pEVar22;
  byte bVar23;
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  undefined8 unaff_R14;
  RGBA *pRVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  Bool bg_is_zero [4];
  Bool bg_priority [4];
  char local_f9;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_a8 [10];
  ulong local_80;
  ulong local_78;
  PaletteRGBA *local_70;
  ColorPalettes *local_68;
  Emulator *local_60;
  PaletteRGBA *local_58;
  ulong local_50;
  ColorPalettes *local_48;
  ulong local_40;
  ulong local_38;
  
  bVar24 = (e->state).ppu.render_x;
  local_40 = CONCAT71((int7)((ulong)unaff_R14 >> 8),bVar24);
  if (bVar24 < 0xa0 && (e->state).ppu.stat.mode == PPU_MODE_MODE3) {
    if (((e->state).is_cgb == FALSE) && ((e->state).ppu.lcdc.bg_display == FALSE)) {
      bVar28 = false;
    }
    else {
      bVar28 = (e->config).disable_bg == FALSE;
    }
    iVar6 = 0;
    if ((e->state).ppu.lcdc.obj_display == FALSE) {
      bVar29 = false;
    }
    else {
      bVar29 = (e->config).disable_obj == FALSE;
    }
    bVar2 = (e->state).ppu.line_y;
    bVar30 = (e->state).ppu.rendering_window == FALSE;
    if (bVar30) {
      iVar6 = 0xff;
    }
    if ((((bVar30) && ((e->state).ppu.lcdc.window_display != FALSE)) &&
        ((e->config).disable_window == FALSE)) &&
       ((uVar25 = (uint)(e->state).ppu.wx, uVar25 < 0xa7 && ((e->state).ppu.wy <= bVar2)))) {
      iVar13 = uVar25 - bVar24;
      iVar6 = 7;
      if (7 < iVar13) {
        iVar6 = iVar13;
      }
      iVar6 = iVar6 + -7;
    }
    local_78 = (e->state).ppu.mode3_render_ticks;
    local_80 = (e->state).ticks;
    uVar25 = (uint)local_40;
    pEVar22 = e;
    if (bVar24 < 0xa0 && local_78 < local_80) {
      pRVar27 = ppu_mode3_synchronize::s_dummy_frame_buffer_line;
      if ((e->state).sgb.mask == SGB_MASK_CANCEL) {
        pRVar27 = e->frame_buffer + ((uint)bVar2 * 0xa0 + (uint)bVar24);
      }
      bVar8 = (e->state).ppu.scy + bVar2;
      local_f0 = (uint)bVar8;
      local_ec = (uint)(bVar8 >> 3) * 0x20 +
                 (uint)((e->state).ppu.lcdc.bg_tile_map_select != TILE_MAP_9800_9BFF) * 0x400 +
                 0x1800;
      uVar26 = (ulong)(byte)((e->state).ppu.scx + bVar24);
      TVar4 = (e->state).ppu.lcdc.bg_tile_data_select;
      local_48 = &(e->state).ppu.bgcp;
      local_70 = e->sgb_pal;
      local_68 = &(e->state).ppu.obcp;
      local_f9 = -bVar24;
      uVar10 = (uint)(byte)(bVar24 + 7);
      uVar20 = 0;
      local_58 = (PaletteRGBA *)0x0;
      bVar24 = 0;
      bVar8 = 0;
      local_f4 = 0;
      local_60 = e;
      do {
        local_a8[0] = 1;
        local_a8[1] = 1;
        local_a8[2] = 1;
        local_a8[3] = 1;
        local_a8[4] = 0;
        local_a8[5] = 0;
        local_a8[6] = 0;
        local_a8[7] = 0;
        lVar7 = 0;
        do {
          if (iVar6 == (int)lVar7) {
            (pEVar22->state).ppu.rendering_window = TRUE;
            uVar26 = (ulong)((uint)(byte)-(pEVar22->state).ppu.wx + uVar10 + (int)lVar7);
            local_f0 = (uint)(pEVar22->state).ppu.win_y;
            local_ec = (uint)((pEVar22->state).ppu.lcdc.window_tile_map_select != TILE_MAP_9800_9BFF
                             ) * 0x400 + (local_f0 & 0xf8) * 4 + 0x1800;
            uVar20 = 0;
            bVar28 = true;
          }
          if (bVar28) {
            uVar17 = (uint)((byte)(uVar26 >> 3) & 0x1f);
            uVar25 = uVar17 | local_ec;
            if ((short)uVar20 == (short)uVar25) {
              bVar24 = bVar24 * '\x02';
              bVar8 = bVar8 * '\x02';
              uVar25 = uVar20;
            }
            else {
              uVar21 = (ulong)(uVar17 | local_ec);
              bVar24 = (pEVar22->state).vram.data[uVar21];
              bVar8 = (byte)local_f0 & 7;
              uVar16 = (ushort)bVar24;
              if (TVar4 == TILE_DATA_8800_97FF) {
                uVar16 = (short)(char)bVar24 + 0x100;
              }
              if ((pEVar22->state).is_cgb == FALSE) {
                local_58 = e->pal;
                if ((pEVar22->state).is_sgb != FALSE) {
                  local_58 = (PaletteRGBA *)
                             ((long)e->sgb_pal[0].color +
                             (ulong)(((pEVar22->state).sgb.attr_map
                                      [(int)((local_40 & 0xff) >> 3) + (bVar2 >> 1 & 0x7ffffffc) * 5
                                       >> 2] >> (~((byte)(local_40 >> 2) & 0x3f) & 6) & 3) << 4));
                }
                uVar21 = (ulong)(ushort)((short)((int)(short)uVar16 << 4) + (ushort)bVar8 * 2);
                bVar24 = (pEVar22->state).vram.data[uVar21];
                bVar8 = (pEVar22->state).vram.data[uVar21 + 1];
                bVar18 = 0;
              }
              else {
                bVar23 = (pEVar22->state).vram.data[uVar21 + 0x2000];
                local_58 = (PaletteRGBA *)
                           ((long)local_48->palettes[0].color + (ulong)((bVar23 & 7) << 4));
                bVar18 = bVar23 >> 7;
                bVar8 = bVar8 * '\x02';
                bVar24 = bVar8 ^ 0xe;
                if ((bVar23 & 0x40) == 0) {
                  bVar24 = bVar8;
                }
                uVar21 = (ulong)((uint)bVar24 | (short)uVar16 * 0x10 + (bVar23 & 8) * 0x400 & 0xffff
                                );
                bVar24 = (pEVar22->state).vram.data[uVar21];
                bVar8 = (pEVar22->state).vram.data[uVar21 + 1];
                if ((bVar23 & 0x20) != 0) {
                  bVar24 = bVar24 << 4 | bVar24 >> 4;
                  bVar24 = bVar24 >> 2 & 0x33 | (bVar24 & 0x33) << 2;
                  bVar24 = bVar24 >> 1 & 0x55 | (bVar24 & 0x55) * '\x02';
                  bVar8 = bVar8 << 4 | bVar8 >> 4;
                  bVar8 = bVar8 >> 2 & 0x33 | (bVar8 & 0x33) << 2;
                  bVar8 = bVar8 >> 1 & 0x55 | (bVar8 & 0x55) * '\x02';
                }
              }
              local_f4 = (uint)bVar18;
              bVar18 = (byte)uVar26 & 7;
              bVar24 = bVar24 << bVar18;
              bVar8 = bVar8 << bVar18;
            }
            bVar18 = bVar24 >> 7 | bVar8 >> 6 & 2;
            pRVar27[lVar7] = local_58->color[bVar18];
            local_a8[lVar7] = (uint)(bVar18 == 0);
            local_a8[lVar7 + 4] = local_f4;
            uVar20 = uVar25;
          }
          else {
            if ((pEVar22->state).is_cgb == FALSE) {
              if ((pEVar22->state).is_sgb == FALSE) {
                RVar11 = pEVar22->color_to_rgba[0].color[0];
              }
              else {
                RVar11 = pEVar22->sgb_pal[0].color[0];
              }
            }
            else {
              RVar11 = (pEVar22->state).ppu.bgcp.palettes[0].color[0];
            }
            pRVar27[lVar7] = RVar11;
          }
          lVar7 = lVar7 + 1;
          uVar26 = (ulong)(byte)((byte)uVar26 + 1);
        } while (lVar7 != 4);
        if (((pEVar22->state).is_cgb != FALSE) && ((pEVar22->state).ppu.lcdc.bg_display == FALSE)) {
          local_a8[0] = 0x1010101;
          local_a8[1] = 0x1010101;
          local_a8[2] = 0x1010101;
          local_a8[3] = 0x1010101;
          local_a8[4] = 0;
          local_a8[5] = 0;
          local_a8[6] = 0;
          local_a8[7] = 0;
        }
        if ((bVar29) && (local_38 = (ulong)(pEVar22->state).ppu.line_obj_count, local_38 != 0)) {
          OVar5 = (pEVar22->state).ppu.lcdc.obj_size;
          local_50 = (ulong)OVar5;
          bVar18 = "\b\x10"[OVar5];
          uVar21 = local_40;
          do {
            uVar3 = (e->state).ppu.line_obj[local_38 - 1].x;
            cVar19 = uVar3 - (char)uVar21;
            bVar23 = cVar19 + 7;
            if ((bVar23 < 0xb) &&
               (bVar12 = bVar2 - (e->state).ppu.line_obj[local_38 - 1].y, bVar12 < bVar18)) {
              bVar15 = ~bVar12 + bVar18;
              if ((e->state).ppu.line_obj[local_38 - 1].yflip == FALSE) {
                bVar15 = bVar12;
              }
              bVar12 = (e->state).ppu.line_obj[local_38 - 1].tile;
              if (OVar5 == OBJ_SIZE_8X16) {
                if (bVar15 < 8) {
                  bVar12 = bVar12 & 0xfe;
                }
                else {
                  bVar12 = bVar12 | 1;
                  bVar15 = bVar15 - 8;
                }
              }
              uVar16 = (ushort)bVar12;
              if ((pEVar22->state).is_cgb == FALSE) {
                pPVar14 = e->pal + (ulong)(e->state).ppu.line_obj[local_38 - 1].palette + 1;
              }
              else {
                pPVar14 = (PaletteRGBA *)
                          ((long)local_68->palettes[0].color +
                          (ulong)(((e->state).ppu.line_obj[local_38 - 1].cgb_palette & 7) << 4));
                if ((e->state).ppu.line_obj[local_38 - 1].bank != '\0') {
                  uVar16 = uVar16 + 0x200;
                }
              }
              uVar21 = (ulong)((uint)uVar16 * 0x10 + (uint)(bVar15 & 7) * 2);
              bVar12 = (pEVar22->state).vram.data[uVar21];
              bVar15 = (pEVar22->state).vram.data[uVar21 + 1];
              if ((e->state).ppu.line_obj[local_38 - 1].xflip == FALSE) {
                bVar12 = bVar12 << 4 | bVar12 >> 4;
                bVar12 = bVar12 >> 2 & 0x33 | (bVar12 & 0x33) << 2;
                bVar12 = bVar12 >> 1 & 0x55 | (bVar12 & 0x55) * '\x02';
                bVar15 = bVar15 << 4 | bVar15 >> 4;
                bVar15 = bVar15 >> 2 & 0x33 | (bVar15 & 0x33) << 2;
                bVar15 = bVar15 >> 1 & 0x55 | (bVar15 & 0x55) * '\x02';
              }
              if (cVar19 < -7) {
                __assert_fail("tile_data_offset >= 0 && tile_data_offset < 8",
                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                              ,0xdc6,"void ppu_mode3_synchronize(Emulator *)");
              }
              if ('\x03' < cVar19) {
                __assert_fail("start >= 0 && start < 4",
                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                              ,0xdcb,"void ppu_mode3_synchronize(Emulator *)");
              }
              bVar9 = -cVar19;
              if (-1 < cVar19) {
                bVar9 = 0;
              }
              uVar25 = (uint)(bVar15 >> (bVar9 & 0x1f));
              uVar17 = (uint)(bVar12 >> (bVar9 & 0x1f));
              bVar12 = bVar23;
              if ('\x02' < (char)bVar23) {
                bVar12 = 3;
              }
              if ((char)bVar23 < '\0') {
                __assert_fail("end >= 0 && end < 4",
                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                              ,0xdcd,"void ppu_mode3_synchronize(Emulator *)");
              }
              pEVar22 = local_60;
              if (cVar19 <= (char)bVar12) {
                bVar23 = uVar3 + local_f9;
                if ((char)bVar23 < '\x01') {
                  bVar23 = 0;
                }
                uVar21 = (ulong)bVar23 - 1;
                do {
                  uVar1 = (uVar17 & 1) + (uVar25 & 1) * 2;
                  if (((uVar1 != 0) && ((local_a8[uVar21 + 5] == 0 || (local_a8[uVar21 + 1] != 0))))
                     && (((e->state).ppu.line_obj[local_38 - 1].priority == OBJ_PRIORITY_ABOVE_BG ||
                         (local_a8[uVar21 + 1] != 0)))) {
                    pRVar27[uVar21 + 1] = pPVar14->color[uVar1];
                  }
                  uVar17 = uVar17 >> 1;
                  uVar25 = uVar25 >> 1;
                  uVar21 = uVar21 + 1;
                  pEVar22 = e;
                } while (uVar21 < bVar12);
              }
            }
            bVar30 = 1 < (long)local_38;
            uVar21 = local_40;
            local_38 = local_38 - 1;
          } while (bVar30);
        }
        local_78 = local_78 + 4;
        (pEVar22->state).ppu.mode3_render_ticks = local_78;
        uVar25 = (int)local_40 + 4;
        if (local_80 <= local_78) break;
        pRVar27 = pRVar27 + 4;
        local_f9 = local_f9 + -4;
        uVar10 = uVar10 + 4;
        iVar6 = iVar6 + -4;
        bVar18 = (byte)local_40;
        local_40 = (ulong)uVar25;
      } while (bVar18 < 0x9c);
    }
    (pEVar22->state).ppu.render_x = (u8)uVar25;
  }
  return;
}

Assistant:

static void ppu_mode3_synchronize(Emulator* e) {
  u8 x = PPU.render_x;
  const u8 y = PPU.line_y;
  if (STAT.mode != PPU_MODE_MODE3 || x >= SCREEN_WIDTH) return;

  Bool display_bg = (IS_CGB || LCDC.bg_display) && !e->config.disable_bg;
  const Bool display_obj = LCDC.obj_display && !e->config.disable_obj;
  Bool rendering_window = PPU.rendering_window;
  int window_counter = rendering_window ? 0 : 255;
  if (!rendering_window && LCDC.window_display && !e->config.disable_window &&
      PPU.wx <= WINDOW_MAX_X && y >= PPU.wy) {
    window_counter = MAX(0, PPU.wx - (x + WINDOW_X_OFFSET));
  }

  const TileDataSelect data_select = LCDC.bg_tile_data_select;
  u8 mx = PPU.scx + x;
  u8 my = PPU.scy + y;
  u16 map_base = map_select_to_address(LCDC.bg_tile_map_select) |
                 ((my >> 3) * TILE_MAP_WIDTH);
  RGBA* pixel;
  if (SGB.mask != SGB_MASK_CANCEL) {
    static RGBA s_dummy_frame_buffer_line[SCREEN_WIDTH];
    pixel = s_dummy_frame_buffer_line;
  } else {
    pixel = &e->frame_buffer[y * SCREEN_WIDTH + x];
  }

  /* Cache map_addr info. */
  u16 map_addr = 0;
  PaletteRGBA* pal = NULL;
  u8 lo = 0, hi = 0;

  Bool priority = FALSE;
  int i;
  for (; PPU.mode3_render_ticks < TICKS && x < SCREEN_WIDTH;
       PPU.mode3_render_ticks += CPU_TICK, pixel += 4, x += 4) {
    Bool bg_is_zero[4] = {TRUE, TRUE, TRUE, TRUE},
         bg_priority[4] = {FALSE, FALSE, FALSE, FALSE};

    for (i = 0; i < 4; ++i, ++mx) {
      if (UNLIKELY(window_counter-- == 0)) {
        PPU.rendering_window = rendering_window = display_bg = TRUE;
        mx = x + i + WINDOW_X_OFFSET - PPU.wx;
        my = PPU.win_y;
        map_base = map_select_to_address(LCDC.window_tile_map_select) |
                   ((my >> 3) * TILE_MAP_WIDTH);
        map_addr = 0;
      }
      if (display_bg) {
        u16 new_map_addr = map_base | (mx >> 3);
        if (map_addr == new_map_addr) {
          lo <<= 1;
          hi <<= 1;
        } else {
          map_addr = new_map_addr;
          u16 tile_index = VRAM.data[map_addr];
          u8 my7 = my & 7;
          if (data_select == TILE_DATA_8800_97FF) {
            tile_index = 256 + (s8)tile_index;
          }
          if (IS_CGB) {
            u8 attr = VRAM.data[0x2000 + map_addr];
            pal = &PPU.bgcp.palettes[attr & 0x7];
            if (attr & 0x08) { tile_index += 0x200; }
            if (attr & 0x40) { my7 = 7 - my7; }
            priority = (attr & 0x80) != 0;
            u16 tile_addr = (tile_index * TILE_HEIGHT + my7) * TILE_ROW_BYTES;
            lo = VRAM.data[tile_addr];
            hi = VRAM.data[tile_addr + 1];
            if (attr & 0x20) {
              lo = reverse_bits_u8(lo);
              hi = reverse_bits_u8(hi);
            }
          } else {
            if (IS_SGB) {
              int idx = (y >> 3) * (SCREEN_WIDTH >> 3) + (x >> 3);
              u8 palidx = (SGB.attr_map[idx >> 2] >> (2 * (3 - (idx & 3)))) & 3;
              pal = &e->sgb_pal[palidx];
            } else {
              pal = &e->pal[PALETTE_TYPE_BGP];
            }
            priority = FALSE;
            u16 tile_addr = (tile_index * TILE_HEIGHT + my7) * TILE_ROW_BYTES;
            lo = VRAM.data[tile_addr];
            hi = VRAM.data[tile_addr + 1];
          }
          u8 shift = mx & 7;
          lo <<= shift;
          hi <<= shift;
        }
        u8 palette_index = ((hi >> 6) & 2) | (lo >> 7);
        pixel[i] = pal->color[palette_index];
        bg_is_zero[i] = palette_index == 0;
        bg_priority[i] = priority;
      } else {
        if (IS_CGB) {
          pixel[i] = PPU.bgcp.palettes[0].color[0];
        } else if (IS_SGB) {
          pixel[i] = e->sgb_pal[0].color[0];
        } else {
          pixel[i] = e->color_to_rgba[0].color[0];
        }
      }
    }

    /* LCDC bit 0 works differently on cgb; when it's cleared OBJ will always
     * have priority over bg and window. */
    if (IS_CGB && !LCDC.bg_display) {
      memset(&bg_is_zero, TRUE, sizeof(bg_is_zero));
      memset(&bg_priority, FALSE, sizeof(bg_priority));
    }

    if (display_obj) {
      u8 obj_height = s_obj_size_to_height[LCDC.obj_size];
      int n;
      for (n = PPU.line_obj_count - 1; n >= 0; --n) {
        Obj* o = &PPU.line_obj[n];
        /* Does [x, x + 4) intersect [o->x, o->x + 8)? Note that the sums must
         * wrap at 256 (i.e. arithmetic is 8-bit). */
        s8 ox_start = o->x - x;
        s8 ox_end = ox_start + 7; /* ox_end is inclusive. */
        u8 oy = y - o->y;
        if (((u8)ox_start >= 4 && (u8)ox_end >= 8) || oy >= obj_height) {
          continue;
        }

        if (o->yflip) {
          oy = obj_height - 1 - oy;
        }

        u16 tile_index = o->tile;
        if (obj_height == 16) {
          if (oy < 8) {
            /* Top tile of 8x16 sprite. */
            tile_index &= 0xfe;
          } else {
            /* Bottom tile of 8x16 sprite. */
            tile_index |= 0x01;
            oy -= 8;
          }
        }
        PaletteRGBA* pal = NULL;
        if (IS_CGB) {
          pal = &PPU.obcp.palettes[o->cgb_palette & 0x7];
          if (o->bank) { tile_index += 0x200; }
        } else {
          pal = &e->pal[o->palette + 1];
        }
        u16 tile_addr = (tile_index * TILE_HEIGHT + (oy & 7)) * TILE_ROW_BYTES;
        u8 lo = VRAM.data[tile_addr];
        u8 hi = VRAM.data[tile_addr + 1];
        if (!o->xflip) {
          lo = reverse_bits_u8(lo);
          hi = reverse_bits_u8(hi);
        }

        int tile_data_offset = MAX(0, -ox_start);
        assert(tile_data_offset >= 0 && tile_data_offset < 8);
        lo >>= tile_data_offset;
        hi >>= tile_data_offset;

        int start = MAX(0, ox_start);
        assert(start >= 0 && start < 4);
        int end = MIN(3, ox_end); /* end is inclusive. */
        assert(end >= 0 && end < 4);
        for (i = start; i <= end; ++i, lo >>= 1, hi >>= 1) {
          u8 palette_index = ((hi & 1) << 1) | (lo & 1);
          if (palette_index != 0 && (!bg_priority[i] || bg_is_zero[i]) &&
              (o->priority == OBJ_PRIORITY_ABOVE_BG || bg_is_zero[i])) {
            pixel[i] = pal->color[palette_index];
          }
        }
      }
    }
  }
  PPU.render_x = x;
}